

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O0

void soplex::
     LPFwriteBounds<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
               (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *p_lp,ostream *p_output,NameSet *p_cnames)

{
  int iVar1;
  bool bVar2;
  type_conflict5 tVar3;
  int iVar4;
  ulong *puVar5;
  char *pcVar6;
  ostream *poVar7;
  ostream *in_RSI;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  upper;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  lower;
  int j;
  char name [16];
  undefined4 in_stack_fffffffffffffde8;
  int in_stack_fffffffffffffdec;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffdf0;
  NameSet *in_stack_fffffffffffffdf8;
  cpp_dec_float<50U,_int,_void> *in_stack_fffffffffffffe00;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffe08;
  undefined1 local_1d8 [56];
  undefined4 local_1a0;
  undefined4 local_19c;
  undefined1 local_198 [16];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffe78;
  ostream *in_stack_fffffffffffffe80;
  ulong local_160;
  undefined1 local_154 [56];
  undefined1 local_11c [56];
  undefined1 local_e4 [56];
  int local_ac;
  ostream *local_90;
  undefined8 local_80;
  ulong *local_78;
  undefined1 *local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined1 *local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined1 *local_40;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_38;
  undefined1 *local_30;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_28;
  undefined1 *local_20;
  undefined8 local_18;
  undefined8 local_10;
  ulong *local_8;
  
  local_90 = in_RSI;
  std::operator<<(in_RSI,"Bounds\n");
  for (local_ac = 0; iVar1 = local_ac,
      iVar4 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)0x1b9e16), iVar1 < iVar4; local_ac = local_ac + 1) {
    local_38 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::lower(in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec);
    local_30 = local_e4;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffdf0,
               (cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
    local_28 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::upper(in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec);
    local_20 = local_11c;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffdf0,
               (cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
    bVar2 = boost::multiprecision::operator==
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x1b9ebb);
    if (bVar2) {
      poVar7 = std::operator<<(local_90,"  ");
      pcVar6 = getColName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                         (in_stack_fffffffffffffe08,(int)((ulong)in_stack_fffffffffffffe00 >> 0x20),
                          in_stack_fffffffffffffdf8,(char *)in_stack_fffffffffffffdf0);
      poVar7 = std::operator<<(poVar7,pcVar6);
      std::operator<<(poVar7," = ");
      poVar7 = boost::multiprecision::operator<<
                         (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
      std::operator<<(poVar7,'\n');
    }
    else {
      puVar5 = (ulong *)infinity();
      local_160 = *puVar5 ^ 0x8000000000000000;
      local_70 = local_154;
      local_78 = &local_160;
      local_80 = 0;
      local_8 = local_78;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (in_stack_fffffffffffffe00,(double)in_stack_fffffffffffffdf8,
                 in_stack_fffffffffffffdf0);
      tVar3 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x1b9fd3);
      if (tVar3) {
        local_60 = infinity();
        local_58 = local_198;
        local_68 = 0;
        local_10 = local_60;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  (in_stack_fffffffffffffe00,(double)in_stack_fffffffffffffdf8,
                   in_stack_fffffffffffffdf0);
        tVar3 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x1ba047);
        if (tVar3) {
          local_19c = 0;
          tVar3 = boost::multiprecision::operator!=
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)in_stack_fffffffffffffdf8,(int *)in_stack_fffffffffffffdf0);
          if (tVar3) {
            std::operator<<(local_90,"  ");
            poVar7 = boost::multiprecision::operator<<
                               (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
            poVar7 = std::operator<<(poVar7," <= ");
            pcVar6 = getColName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                               (in_stack_fffffffffffffe08,
                                (int)((ulong)in_stack_fffffffffffffe00 >> 0x20),
                                in_stack_fffffffffffffdf8,(char *)in_stack_fffffffffffffdf0);
            poVar7 = std::operator<<(poVar7,pcVar6);
            std::operator<<(poVar7," <= ");
            poVar7 = boost::multiprecision::operator<<
                               (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
            std::operator<<(poVar7,'\n');
          }
          else {
            in_stack_fffffffffffffe08 =
                 (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)std::operator<<(local_90,"  ");
            pcVar6 = getColName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                               (in_stack_fffffffffffffe08,
                                (int)((ulong)in_stack_fffffffffffffe00 >> 0x20),
                                in_stack_fffffffffffffdf8,(char *)in_stack_fffffffffffffdf0);
            poVar7 = std::operator<<((ostream *)in_stack_fffffffffffffe08,pcVar6);
            std::operator<<(poVar7," <= ");
            poVar7 = boost::multiprecision::operator<<
                               (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
            std::operator<<(poVar7,'\n');
          }
        }
        else {
          local_1a0 = 0;
          tVar3 = boost::multiprecision::operator!=
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)in_stack_fffffffffffffdf8,(int *)in_stack_fffffffffffffdf0);
          if (tVar3) {
            std::operator<<(local_90,"  ");
            poVar7 = boost::multiprecision::operator<<
                               (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
            in_stack_fffffffffffffe00 =
                 (cpp_dec_float<50U,_int,_void> *)std::operator<<(poVar7," <= ");
            pcVar6 = getColName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                               (in_stack_fffffffffffffe08,
                                (int)((ulong)in_stack_fffffffffffffe00 >> 0x20),
                                in_stack_fffffffffffffdf8,(char *)in_stack_fffffffffffffdf0);
            poVar7 = std::operator<<((ostream *)in_stack_fffffffffffffe00,pcVar6);
            std::operator<<(poVar7,'\n');
          }
        }
      }
      else {
        local_48 = infinity();
        local_40 = local_1d8;
        local_50 = 0;
        local_18 = local_48;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  (in_stack_fffffffffffffe00,(double)in_stack_fffffffffffffdf8,
                   in_stack_fffffffffffffdf0);
        tVar3 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x1ba287);
        if (tVar3) {
          in_stack_fffffffffffffdf8 = (NameSet *)std::operator<<(local_90,"   -Inf <= ");
          pcVar6 = getColName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                             (in_stack_fffffffffffffe08,
                              (int)((ulong)in_stack_fffffffffffffe00 >> 0x20),
                              in_stack_fffffffffffffdf8,(char *)in_stack_fffffffffffffdf0);
          poVar7 = std::operator<<((ostream *)in_stack_fffffffffffffdf8,pcVar6);
          std::operator<<(poVar7," <= ");
          poVar7 = boost::multiprecision::operator<<
                             (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
          std::operator<<(poVar7,'\n');
        }
        else {
          in_stack_fffffffffffffdf0 =
               (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)std::operator<<(local_90,"  ");
          pcVar6 = getColName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                             (in_stack_fffffffffffffe08,
                              (int)((ulong)in_stack_fffffffffffffe00 >> 0x20),
                              in_stack_fffffffffffffdf8,(char *)in_stack_fffffffffffffdf0);
          poVar7 = std::operator<<((ostream *)in_stack_fffffffffffffdf0,pcVar6);
          std::operator<<(poVar7," free\n");
        }
      }
    }
  }
  return;
}

Assistant:

static void LPFwriteBounds(
   const SPxLPBase<R>&   p_lp,       ///< the LP to write
   std::ostream&            p_output,   ///< output stream
   const NameSet*           p_cnames    ///< column names
)
{

   char name[16];

   p_output << "Bounds\n";

   for(int j = 0; j < p_lp.nCols(); ++j)
   {
      const R lower = p_lp.lower(j);
      const R upper = p_lp.upper(j);

      if(lower == upper)
      {
         p_output << "  "   << getColName(p_lp, j, p_cnames, name) << " = "  << upper << '\n';
      }
      else if(lower > R(-infinity))
      {
         if(upper < R(infinity))
         {
            // range bound
            if(lower != 0)
               p_output << "  "   << lower << " <= "
                        << getColName(p_lp, j, p_cnames, name)
                        << " <= " << upper << '\n';
            else
               p_output << "  "   << getColName(p_lp, j, p_cnames, name)
                        << " <= " << upper << '\n';
         }
         else if(lower != 0)
            p_output << "  " << lower << " <= "
                     << getColName(p_lp, j, p_cnames, name)
                     << '\n';
      }
      else if(upper < R(infinity))
         p_output << "   -Inf <= "
                  << getColName(p_lp, j, p_cnames, name)
                  << " <= " << upper << '\n';
      else
         p_output << "  "   << getColName(p_lp, j, p_cnames, name)
                  << " free\n";
   }
}